

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_test.cc
# Opt level: O0

void __thiscall
wiener_highbd::SearchWienerTest_DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2_Test::TestBody
          (SearchWienerTest_DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t iter;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  aom_image_t img;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  aom_codec_ctx_t enc;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  uchar *img_data3;
  uchar *img_data2;
  uchar *img_data1;
  int kHeight;
  int kWidth;
  aom_codec_ctx_t *in_stack_fffffffffffff3e8;
  AssertHelper *in_stack_fffffffffffff3f0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff3f8;
  undefined1 in_stack_fffffffffffff3ff;
  aom_codec_iface_t *in_stack_fffffffffffff400;
  aom_codec_iter_t *in_stack_fffffffffffff408;
  AssertionResult *this_01;
  int line;
  uint in_stack_fffffffffffff410;
  uint in_stack_fffffffffffff414;
  undefined4 uVar4;
  aom_image_t *in_stack_fffffffffffff418;
  Type type;
  aom_image_t *in_stack_fffffffffffff420;
  AssertionResult *this_02;
  Message *in_stack_fffffffffffff468;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff477;
  AssertionResult local_948 [2];
  undefined8 local_928;
  AssertionResult local_920 [2];
  aom_codec_err_t local_900;
  undefined4 local_8fc;
  AssertionResult local_8f8 [2];
  undefined8 local_8d8;
  AssertionResult local_8d0 [2];
  undefined4 local_8b0;
  uint local_8ac;
  AssertionResult local_8a8 [2];
  undefined4 local_884;
  AssertionResult local_880 [2];
  undefined8 local_860;
  AssertionResult local_858 [2];
  undefined4 local_838;
  aom_codec_err_t local_834;
  AssertionResult local_830 [2];
  aom_image_t *local_810;
  undefined1 *local_808;
  AssertionResult local_800 [2];
  undefined8 local_7e0;
  AssertionResult local_7d8 [2];
  undefined4 local_7b8;
  uint local_7b4;
  AssertionResult local_7b0 [2];
  undefined4 local_78c;
  AssertionResult local_788 [2];
  undefined8 local_768;
  AssertionResult local_760 [2];
  undefined4 local_740;
  aom_codec_err_t local_73c;
  AssertionResult local_738 [2];
  aom_image_t *local_718;
  undefined1 *local_710;
  AssertionResult local_708 [2];
  undefined8 local_6e8;
  AssertionResult local_6e0 [2];
  undefined4 local_6c0;
  uint local_6bc;
  AssertionResult local_6b8 [2];
  undefined4 local_694;
  AssertionResult local_690;
  uint local_67c;
  undefined8 local_668;
  AssertionResult local_660;
  aom_codec_cx_pkt_t *local_650;
  undefined8 local_648;
  undefined4 local_630;
  aom_codec_err_t local_62c;
  AssertionResult local_628 [2];
  aom_image_t *local_608;
  undefined1 *local_600;
  AssertionResult local_5f8;
  undefined1 local_5e8 [16];
  undefined4 local_5d8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined4 local_58c;
  undefined4 local_588;
  aom_codec_err_t local_530;
  undefined4 local_52c;
  AssertionResult local_528 [2];
  aom_codec_err_t local_508;
  undefined4 local_504;
  AssertionResult local_500 [2];
  aom_codec_err_t local_4e0;
  undefined4 local_4dc;
  AssertionResult local_4d8 [2];
  aom_codec_err_t local_4b8;
  undefined4 local_4b4;
  AssertionResult local_4b0 [2];
  aom_codec_err_t local_490;
  undefined4 local_48c;
  AssertionResult local_488 [2];
  aom_codec_err_t local_468;
  undefined4 local_464;
  AssertionResult local_460 [2];
  aom_codec_err_t local_440;
  undefined4 local_43c;
  AssertionResult local_438;
  aom_codec_ctx_t local_428;
  aom_codec_err_t local_3d0;
  undefined4 local_3cc;
  AssertionResult local_3c8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_380;
  undefined4 local_358;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 local_2e8;
  aom_codec_iface_t *local_30;
  uint16_t *local_28;
  uint16_t *local_20;
  uint16_t *local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 4;
  local_10 = 2;
  local_18 = TestBody::kBuffer1;
  local_20 = TestBody::kBuffer2;
  local_28 = TestBody::kBuffer3;
  local_30 = aom_codec_av1_cx();
  local_3cc = 0;
  local_3d0 = aom_codec_enc_config_default
                        (in_stack_fffffffffffff400,
                         (aom_codec_enc_cfg_t *)
                         CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                         (uint)((ulong)in_stack_fffffffffffff3f0 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd388d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd3893b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd38993);
  local_358 = 3;
  local_3b0 = 2;
  local_398 = 0xc;
  local_394 = 0xc;
  local_3ac = 4;
  local_3a8 = 2;
  local_380 = 0;
  local_3b4 = 0x20;
  local_2e8 = 1;
  local_32c = 0x33;
  local_328 = 0x37;
  local_43c = 0;
  local_440 = aom_codec_enc_init_ver
                        ((aom_codec_ctx_t *)in_stack_fffffffffffff420,
                         (aom_codec_iface_t *)in_stack_fffffffffffff418,
                         (aom_codec_enc_cfg_t *)
                         CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                         (aom_codec_flags_t)in_stack_fffffffffffff408,
                         (int)((ulong)in_stack_fffffffffffff400 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd38ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd38b4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd38ba3);
  local_464 = 0;
  local_468 = aom_codec_control(&local_428,0x19,0x35);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd38c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd38cd3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd38d2b);
  local_48c = 0;
  local_490 = aom_codec_control(&local_428,0x22,3);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd38df8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd38e5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd38eb3);
  local_4b4 = 0;
  local_4b8 = aom_codec_control(&local_428,0x21,6);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd38f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd38fe3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3903b);
  local_4dc = 0;
  local_4e0 = aom_codec_control(&local_428,0xd,6);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd39108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd3916b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd391c3);
  local_504 = 0;
  local_508 = aom_codec_control(&local_428,0x34,1);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_500);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd39290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd392f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3934b);
  local_52c = 0;
  local_530 = aom_codec_control(&local_428,0x18,1);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd39418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd3947b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd394d3);
  local_600 = local_5e8;
  local_608 = aom_img_wrap(in_stack_fffffffffffff420,
                           (aom_img_fmt_t)((ulong)in_stack_fffffffffffff418 >> 0x20),
                           (uint)in_stack_fffffffffffff418,in_stack_fffffffffffff414,
                           in_stack_fffffffffffff410,(uchar *)in_stack_fffffffffffff408);
  testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_image **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_image **)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd395af);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd39612);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3966a);
  local_5d8 = 1;
  local_598 = 0;
  local_5a0 = 0;
  local_588 = 0;
  local_58c = 0;
  local_62c = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff420,
                               in_stack_fffffffffffff418,
                               CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                               (unsigned_long)in_stack_fffffffffffff408,
                               (aom_enc_frame_flags_t)in_stack_fffffffffffff400);
  local_630 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             (aom_codec_err_t *)in_stack_fffffffffffff3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_628);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd39779);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd397dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd39834);
  local_648 = 0;
  local_650 = aom_codec_get_cx_data
                        ((aom_codec_ctx_t *)
                         CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                         in_stack_fffffffffffff408);
  local_668 = 0;
  testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
            ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
             (aom_codec_cx_pkt **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
             &in_stack_fffffffffffff3f0->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_660);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff420);
    testing::AssertionResult::failure_message((AssertionResult *)0xd3990b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff420,
               (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
               (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
    testing::Message::~Message((Message *)0xd3996e);
  }
  local_67c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd399dc);
  if (local_67c == 0) {
    local_694 = 0;
    testing::internal::EqHelper::Compare<aom_codec_cx_pkt_kind,_aom_codec_cx_pkt_kind,_nullptr>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (aom_codec_cx_pkt_kind *)
               CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               (aom_codec_cx_pkt_kind *)in_stack_fffffffffffff3f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_690);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd39a9b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd39afe);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd39b56);
    local_6bc = (local_650->data).frame.flags & 1;
    local_6c0 = 1;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (uint *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               (uint *)in_stack_fffffffffffff3f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd39c18);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd39c7b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd39cd3);
    local_650 = aom_codec_get_cx_data
                          ((aom_codec_ctx_t *)
                           CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff408);
    local_6e8 = 0;
    testing::internal::EqHelper::Compare<const_aom_codec_cx_pkt_*,_std::nullptr_t,_nullptr>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (aom_codec_cx_pkt **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               &in_stack_fffffffffffff3f0->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd39d9e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd39e01);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd39e59);
    local_710 = local_5e8;
    local_718 = aom_img_wrap(in_stack_fffffffffffff420,
                             (aom_img_fmt_t)((ulong)in_stack_fffffffffffff418 >> 0x20),
                             (uint)in_stack_fffffffffffff418,in_stack_fffffffffffff414,
                             in_stack_fffffffffffff410,(uchar *)in_stack_fffffffffffff408);
    testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (aom_image **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               (aom_image **)in_stack_fffffffffffff3f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_708);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd39f35);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd39f98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd39ff0);
    local_5d8 = 1;
    local_598 = 0;
    local_5a0 = 0;
    local_588 = 0;
    local_58c = 0;
    local_73c = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff420,
                                 in_stack_fffffffffffff418,
                                 CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                                 (unsigned_long)in_stack_fffffffffffff408,
                                 (aom_enc_frame_flags_t)in_stack_fffffffffffff400);
    local_740 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               (aom_codec_err_t *)in_stack_fffffffffffff3f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_738);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd3a0ff);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd3a162);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a1ba);
    local_648 = 0;
    local_650 = aom_codec_get_cx_data
                          ((aom_codec_ctx_t *)
                           CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff408);
    local_768 = 0;
    testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
              ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
               (aom_codec_cx_pkt **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
               &in_stack_fffffffffffff3f0->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_760);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff420);
      testing::AssertionResult::failure_message((AssertionResult *)0xd3a291);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff420,
                 (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                 in_stack_fffffffffffff468);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
      testing::Message::~Message((Message *)0xd3a2f4);
    }
    local_67c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a362);
    if (local_67c == 0) {
      local_78c = 0;
      testing::internal::EqHelper::Compare<aom_codec_cx_pkt_kind,_aom_codec_cx_pkt_kind,_nullptr>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (aom_codec_cx_pkt_kind *)
                 CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 (aom_codec_cx_pkt_kind *)in_stack_fffffffffffff3f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_788);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3a421);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3a484);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a4dc);
      local_7b4 = (local_650->data).frame.flags & 1;
      local_7b8 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (uint *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 (uint *)in_stack_fffffffffffff3f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7b0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3a59e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3a601);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a659);
      local_650 = aom_codec_get_cx_data
                            ((aom_codec_ctx_t *)
                             CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff408);
      local_7e0 = 0;
      testing::internal::EqHelper::Compare<const_aom_codec_cx_pkt_*,_std::nullptr_t,_nullptr>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (aom_codec_cx_pkt **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 &in_stack_fffffffffffff3f0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3a724);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3a787);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a7df);
      local_808 = local_5e8;
      local_810 = aom_img_wrap(in_stack_fffffffffffff420,
                               (aom_img_fmt_t)((ulong)in_stack_fffffffffffff418 >> 0x20),
                               (uint)in_stack_fffffffffffff418,in_stack_fffffffffffff414,
                               in_stack_fffffffffffff410,(uchar *)in_stack_fffffffffffff408);
      pAVar5 = local_800;
      testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (aom_image **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 (aom_image **)in_stack_fffffffffffff3f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3a8bb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3a91e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3a976);
      local_5d8 = 1;
      local_598 = 0;
      local_5a0 = 0;
      local_588 = 0;
      local_58c = 0;
      local_834 = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff420,
                                   in_stack_fffffffffffff418,
                                   CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                                   (unsigned_long)in_stack_fffffffffffff408,
                                   (aom_enc_frame_flags_t)in_stack_fffffffffffff400);
      local_838 = 0;
      testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 (aom_codec_err_t *)in_stack_fffffffffffff3f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_830);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3aa85);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3aae8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3ab40);
      local_648 = 0;
      local_650 = aom_codec_get_cx_data
                            ((aom_codec_ctx_t *)
                             CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff408);
      local_860 = 0;
      testing::internal::CmpHelperNE<aom_codec_cx_pkt_const*,decltype(nullptr)>
                ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                 (aom_codec_cx_pkt **)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 &in_stack_fffffffffffff3f0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_858);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffff420);
        testing::AssertionResult::failure_message((AssertionResult *)0xd3ac17);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffff420,
                   (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                   (int)((ulong)in_stack_fffffffffffff408 >> 0x20),(char *)in_stack_fffffffffffff400
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                   in_stack_fffffffffffff468);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
        testing::Message::~Message((Message *)0xd3ac7a);
      }
      local_67c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3ace8);
      if (local_67c == 0) {
        local_884 = 0;
        pAVar5 = local_880;
        testing::internal::EqHelper::Compare<aom_codec_cx_pkt_kind,_aom_codec_cx_pkt_kind,_nullptr>
                  ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                   (aom_codec_cx_pkt_kind *)
                   CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   (aom_codec_cx_pkt_kind *)in_stack_fffffffffffff3f0);
        uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
        if (!(bool)uVar2) {
          testing::Message::Message((Message *)in_stack_fffffffffffff420);
          testing::AssertionResult::failure_message((AssertionResult *)0xd3ada7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff420,
                     (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                     (int)((ulong)in_stack_fffffffffffff408 >> 0x20),
                     (char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
          testing::Message::~Message((Message *)0xd3ae04);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3ae59);
        local_8ac = (local_650->data).frame.flags & 1;
        local_8b0 = 0;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                   (uint *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   (uint *)in_stack_fffffffffffff3f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff420);
          testing::AssertionResult::failure_message((AssertionResult *)0xd3af0f);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff420,
                     (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                     (int)((ulong)in_stack_fffffffffffff408 >> 0x20),
                     (char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
          testing::Message::~Message((Message *)0xd3af6c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3afc4);
        local_650 = aom_codec_get_cx_data
                              ((aom_codec_ctx_t *)
                               CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                               in_stack_fffffffffffff408);
        local_8d8 = 0;
        testing::internal::EqHelper::Compare<const_aom_codec_cx_pkt_*,_std::nullptr_t,_nullptr>
                  ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                   (aom_codec_cx_pkt **)
                   CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   &in_stack_fffffffffffff3f0->data_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8d0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffff420);
          testing::AssertionResult::failure_message((AssertionResult *)0xd3b083);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff420,
                     (Type)((ulong)in_stack_fffffffffffff418 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                     (int)((ulong)in_stack_fffffffffffff408 >> 0x20),
                     (char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
          testing::Message::~Message((Message *)0xd3b0e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3b138);
        local_8fc = 0;
        local_900 = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff420,
                                     in_stack_fffffffffffff418,
                                     CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                                     (unsigned_long)in_stack_fffffffffffff408,
                                     (aom_enc_frame_flags_t)in_stack_fffffffffffff400);
        type = (Type)((ulong)in_stack_fffffffffffff418 >> 0x20);
        this_02 = local_8f8;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  ((char *)in_stack_fffffffffffff408,(char *)in_stack_fffffffffffff400,
                   (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   (aom_codec_err_t *)in_stack_fffffffffffff3f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0xd3b1fd);
          type = (Type)((ulong)pcVar3 >> 0x20);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,type,
                     (char *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                     (int)((ulong)in_stack_fffffffffffff408 >> 0x20),
                     (char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
          testing::Message::~Message((Message *)0xd3b25a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3b2b2);
        local_648 = 0;
        local_650 = aom_codec_get_cx_data
                              ((aom_codec_ctx_t *)
                               CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                               in_stack_fffffffffffff408);
        local_928 = 0;
        this_01 = local_920;
        testing::internal::EqHelper::Compare<const_aom_codec_cx_pkt_*,_std::nullptr_t,_nullptr>
                  (&this_01->success_,(char *)in_stack_fffffffffffff400,
                   (aom_codec_cx_pkt **)
                   CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   &in_stack_fffffffffffff3f0->data_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
        uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff414);
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          in_stack_fffffffffffff400 =
               (aom_codec_iface_t *)
               testing::AssertionResult::failure_message((AssertionResult *)0xd3b37d);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffff410),
                     (int)((ulong)this_01 >> 0x20),(char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff3f0);
          testing::Message::~Message((Message *)0xd3b3da);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3b42f);
        aom_codec_destroy(in_stack_fffffffffffff3e8);
        this_00 = local_948;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (&this_01->success_,(char *)in_stack_fffffffffffff400,
                   (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                   (aom_codec_err_t *)this_00);
        line = (int)((ulong)this_01 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          testing::AssertionResult::failure_message((AssertionResult *)0xd3b4e4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffff410),
                     line,(char *)in_stack_fffffffffffff400);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff470),(Message *)pAVar5);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0xd3b53f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xd3b594);
      }
    }
  }
  return;
}

Assistant:

TEST(SearchWienerTest, DISABLED_12bitSignedIntegerOverflowInLinsolveWiener2) {
  constexpr int kWidth = 4;
  constexpr int kHeight = 2;
  static constexpr uint16_t kBuffer1[kWidth * kHeight] = {
    // Y plane:
    32, 4095, 2080, 2592, 32, 3104, 4095, 32,
  };
  unsigned char *img_data1 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer1));
  static constexpr uint16_t kBuffer2[kWidth * kHeight] = {
    // Y plane:
    4095, 4095, 2080, 4095, 4095, 32, 4095, 544,
  };
  unsigned char *img_data2 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer2));
  static constexpr uint16_t kBuffer3[kWidth * kHeight] = {
    // Y plane:
    3872, 3872, 3872, 2848, 800, 4095, 32, 3104,
  };
  unsigned char *img_data3 =
      reinterpret_cast<unsigned char *>(const_cast<uint16_t *>(kBuffer3));

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_GOOD_QUALITY));
  cfg.rc_end_usage = AOM_Q;
  cfg.g_profile = 2;
  cfg.g_bit_depth = AOM_BITS_12;
  cfg.g_input_bit_depth = 12;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  cfg.g_lag_in_frames = 0;
  cfg.g_threads = 32;
  cfg.monochrome = 1;
  cfg.rc_min_quantizer = 51;
  cfg.rc_max_quantizer = 55;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_init(&enc, iface, &cfg, AOM_CODEC_USE_HIGHBITDEPTH));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CQ_LEVEL, 53));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AV1E_SET_TILE_ROWS, 3));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AV1E_SET_TILE_COLUMNS, 6));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 6));
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_control(&enc, AV1E_SET_COLOR_RANGE, AOM_CR_FULL_RANGE));
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_control(&enc, AOME_SET_TUNING, AOM_TUNE_SSIM));

  aom_image_t img;

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data1));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  aom_codec_iter_t iter = nullptr;
  const aom_codec_cx_pkt_t *pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x1f0011.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, AOM_FRAME_IS_KEY);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data2));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x20000.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Encode frame
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I42016, kWidth, kHeight, 1,
                               img_data3));
  img.monochrome = 1;
  img.planes[1] = img.planes[2] = nullptr;
  img.stride[1] = img.stride[2] = 0;
  EXPECT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  ASSERT_NE(pkt, nullptr);
  EXPECT_EQ(pkt->kind, AOM_CODEC_CX_FRAME_PKT);
  // pkt->data.frame.flags is 0x20000.
  EXPECT_EQ(pkt->data.frame.flags & AOM_FRAME_IS_KEY, 0u);
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  // Flush encoder
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 1, 0));
  iter = nullptr;
  pkt = aom_codec_get_cx_data(&enc, &iter);
  EXPECT_EQ(pkt, nullptr);

  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}